

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

ExpEmit __thiscall FxForLoop::Emit(FxForLoop *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  size_t sVar4;
  size_t loopstart;
  undefined4 extraout_var_00;
  size_t loc;
  ExpEmit EVar5;
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  TArray<unsigned_long,_unsigned_long> local_48;
  TArray<unsigned_long,_unsigned_long> local_38;
  
  pFVar1 = this->Condition;
  if (pFVar1 != (FxExpression *)0x0) {
    if (pFVar1->ValueType == (PType *)TypeBool) {
      iVar2 = (*pFVar1->_vptr_FxExpression[3])();
      if ((char)iVar2 == '\0') goto LAB_0053b2bd;
      pFVar1 = this->Condition;
    }
    if (pFVar1 != (FxExpression *)0x0) {
      __assert_fail("(Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x242e,"virtual ExpEmit FxForLoop::Emit(VMFunctionBuilder *)");
    }
  }
LAB_0053b2bd:
  local_38.Array = (unsigned_long *)0x0;
  local_38.Most = 0;
  local_38.Count = 0;
  local_48.Array = (unsigned_long *)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  pFVar1 = this->Init;
  if ((pFVar1 != (FxExpression *)0x0) &&
     (uVar3 = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build),
     (CONCAT44(extraout_var,uVar3) & 0x10100fc0000) == 0)) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + (uVar3 >> 0x10 & 3),uVar3 & 0xffff,uVar3 >> 0x18);
  }
  sVar4 = VMFunctionBuilder::GetAddress(build);
  pFVar1 = this->Condition;
  if (pFVar1 != (FxExpression *)0x0) {
    (*pFVar1->_vptr_FxExpression[10])(pFVar1,build,0,&local_38,&local_48);
  }
  VMFunctionBuilder::BackpatchListToHere(build,&local_38);
  if (this->Code != (FxExpression *)0x0) {
    FxExpression::EmitStatement(this->Code,build);
  }
  loopstart = VMFunctionBuilder::GetAddress(build);
  pFVar1 = this->Iteration;
  if ((pFVar1 != (FxExpression *)0x0) &&
     (uVar3 = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build),
     (CONCAT44(extraout_var_00,uVar3) & 0x10100fc0000) == 0)) {
    VMFunctionBuilder::RegAvailability::Return
              (build->Registers + (uVar3 >> 0x10 & 3),uVar3 & 0xffff,uVar3 >> 0x18);
  }
  loc = VMFunctionBuilder::Emit(build,0x44,0);
  VMFunctionBuilder::Backpatch(build,loc,sVar4);
  sVar4 = VMFunctionBuilder::GetAddress(build);
  VMFunctionBuilder::BackpatchListToHere(build,&local_48);
  FxLoopStatement::Backpatch(&this->super_FxLoopStatement,build,loopstart,sVar4);
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_48);
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_38);
  EVar5.RegNum = 0;
  EVar5.RegType = 0x80;
  EVar5.RegCount = '\x01';
  EVar5.Konst = false;
  EVar5.Fixed = false;
  EVar5.Final = false;
  EVar5.Target = false;
  return EVar5;
}

Assistant:

ExpEmit FxForLoop::Emit(VMFunctionBuilder *build)
{
	assert((Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr);

	size_t loopstart, loopend;
	size_t codestart;
	TArray<size_t> yes, no;

	// Init statement (only used by DECORATE. ZScript is pulling it before the loop statement and enclosing the entire loop in a compound statement so that Init can have local variables.)
	if (Init != nullptr)
	{
		ExpEmit init = Init->Emit(build);
		init.Free(build);
	}

	// Evaluate the condition and execute/break out of the loop.
	codestart = build->GetAddress();
	if (Condition != nullptr)
	{
		Condition->EmitCompare(build, false, yes, no);
	}

	build->BackpatchListToHere(yes);
	// Execute the loop's content.
	if (Code != nullptr)
	{
		Code->EmitStatement(build);
	}

	// Iteration statement.
	loopstart = build->GetAddress();
	if (Iteration != nullptr)
	{
		ExpEmit iter = Iteration->Emit(build);
		iter.Free(build);
	}
	build->Backpatch(build->Emit(OP_JMP, 0), codestart);

	// End of loop.
	loopend = build->GetAddress();
	build->BackpatchListToHere(no);

	Backpatch(build, loopstart, loopend);
	return ExpEmit();
}